

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QDate __thiscall QLocale::toDate(QLocale *this,QString *string,FormatType format,int baseYear)

{
  QDate QVar1;
  long in_FS_OFFSET;
  QString local_40;
  QCalendar local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  dateFormat(&local_40,this,format);
  QCalendar::QCalendar(&local_28);
  QVar1 = toDate(this,string,&local_40,local_28,baseYear);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDate)QVar1.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QLocale::toDate(const QString &string, FormatType format, int baseYear) const
{
    return toDate(string, dateFormat(format), baseYear);
}